

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Versions.cpp
# Opt level: O3

void __thiscall
glslang::TParseVersions::explicitInt16Check
          (TParseVersions *this,TSourceLoc *loc,char *op,bool builtIn)

{
  undefined7 in_register_00000009;
  char *extensions [3];
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  char *local_8;
  
  if ((int)CONCAT71(in_register_00000009,builtIn) == 0) {
    local_8 = "GL_EXT_shader_explicit_arithmetic_types_int16";
    local_18 = 0x84365b;
    uStack_14 = 0;
    uStack_10 = 0x843f45;
    uStack_c = 0;
    (*this->_vptr_TParseVersions[5])(this,loc,3,&local_18,op);
  }
  return;
}

Assistant:

void TParseVersions::explicitInt16Check(const TSourceLoc& loc, const char* op, bool builtIn)
{
    if (! builtIn) {
        const char* const extensions[] = {
                                           E_GL_AMD_gpu_shader_int16,
                                           E_GL_EXT_shader_explicit_arithmetic_types,
                                           E_GL_EXT_shader_explicit_arithmetic_types_int16};
        requireExtensions(loc, sizeof(extensions)/sizeof(extensions[0]), extensions, op);
    }
}